

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O0

int ppc_hash32_handle_mmu_fault_ppc(PowerPCCPU_conflict *cpu,vaddr eaddr,int rwx,int mmu_idx)

{
  uint sr_00;
  uint ea;
  ppc_hash_pte32_t pte_00;
  ppc_hash_pte32_t pte_01;
  int iVar1;
  hwaddr pte_offset_00;
  vaddr local_68;
  hwaddr raddr;
  int need_prot [3];
  int prot;
  ppc_hash_pte32_t pte;
  hwaddr pte_offset;
  target_ulong_conflict sr;
  CPUPPCState_conflict *env;
  CPUState_conflict *cs;
  int mmu_idx_local;
  int rwx_local;
  vaddr eaddr_local;
  PowerPCCPU_conflict *cpu_local;
  
  raddr = 0x200000001;
  need_prot[0] = 4;
  if (((rwx != 0) && (rwx != 1)) && (rwx != 2)) {
    __assert_fail("(rwx == 0) || (rwx == 1) || (rwx == 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/ppc/mmu-hash32.c"
                  ,0x1b4,"int ppc_hash32_handle_mmu_fault_ppc(PowerPCCPU *, vaddr, int, int)");
  }
  ea = (uint)eaddr;
  if (((rwx == 2) && (((cpu->env).msr >> 5 & 1) == 0)) ||
     ((rwx != 2 && (((cpu->env).msr >> 4 & 1) == 0)))) {
    local_68 = eaddr;
    tlb_set_page_ppc(&cpu->parent_obj,ea & 0xfffff000,eaddr & 0xfffff000,7,mmu_idx,0x1000);
    cpu_local._4_4_ = 0;
  }
  else {
    if ((cpu->env).nb_BATs != 0) {
      local_68 = ppc_hash32_bat_lookup(cpu,ea,rwx,need_prot + 1);
      if (local_68 != 0xffffffffffffffff) {
        if ((need_prot[(long)rwx + -2] & (need_prot[1] ^ 0xffffffffU)) != 0) {
          if (rwx == 2) {
            (cpu->parent_obj).exception_index = 3;
            (cpu->env).error_code = 0x8000000;
          }
          else {
            (cpu->parent_obj).exception_index = 2;
            (cpu->env).error_code = 0;
            (cpu->env).spr[0x13] = ea;
            if (rwx == 1) {
              (cpu->env).spr[0x12] = 0xa000000;
            }
            else {
              (cpu->env).spr[0x12] = 0x8000000;
            }
          }
          return 1;
        }
        tlb_set_page_ppc(&cpu->parent_obj,ea & 0xfffff000,local_68 & 0xfffff000,need_prot[1],mmu_idx
                         ,0x1000);
        return 0;
      }
      local_68 = 0xffffffffffffffff;
    }
    sr_00 = (cpu->env).sr[eaddr >> 0x1c];
    if ((sr_00 & 0x80000000) == 0) {
      if ((rwx == 2) && ((sr_00 & 0x10000000) != 0)) {
        (cpu->parent_obj).exception_index = 3;
        (cpu->env).error_code = 0x10000000;
        cpu_local._4_4_ = 1;
      }
      else {
        pte_offset_00 = ppc_hash32_htab_lookup(cpu,sr_00,ea,(ppc_hash_pte32_t *)(need_prot + 2));
        if (pte_offset_00 == 0xffffffffffffffff) {
          if (rwx == 2) {
            (cpu->parent_obj).exception_index = 3;
            (cpu->env).error_code = 0x40000000;
          }
          else {
            (cpu->parent_obj).exception_index = 2;
            (cpu->env).error_code = 0;
            (cpu->env).spr[0x13] = ea;
            if (rwx == 1) {
              (cpu->env).spr[0x12] = 0x42000000;
            }
            else {
              (cpu->env).spr[0x12] = 0x40000000;
            }
          }
          cpu_local._4_4_ = 1;
        }
        else {
          pte_00.pte1 = prot;
          pte_00.pte0 = need_prot[2];
          need_prot[1] = ppc_hash32_pte_prot(cpu,sr_00,pte_00);
          if ((need_prot[(long)rwx + -2] & (need_prot[1] ^ 0xffffffffU)) == 0) {
            if ((prot & 0x100U) == 0) {
              ppc_hash32_set_r(cpu,pte_offset_00,prot);
            }
            if ((prot & 0x80U) == 0) {
              if (rwx == 1) {
                ppc_hash32_set_c(cpu,pte_offset_00,(ulong)(uint)prot);
              }
              else {
                need_prot[1] = need_prot[1] & 0xfffffffd;
              }
            }
            pte_01.pte1 = prot;
            pte_01.pte0 = need_prot[2];
            local_68 = ppc_hash32_pte_raddr(sr_00,pte_01,ea);
            tlb_set_page_ppc(&cpu->parent_obj,ea & 0xfffff000,local_68 & 0xfffff000,need_prot[1],
                             mmu_idx,0x1000);
            cpu_local._4_4_ = 0;
          }
          else {
            if (rwx == 2) {
              (cpu->parent_obj).exception_index = 3;
              (cpu->env).error_code = 0x8000000;
            }
            else {
              (cpu->parent_obj).exception_index = 2;
              (cpu->env).error_code = 0;
              (cpu->env).spr[0x13] = ea;
              if (rwx == 1) {
                (cpu->env).spr[0x12] = 0xa000000;
              }
              else {
                (cpu->env).spr[0x12] = 0x8000000;
              }
            }
            cpu_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      iVar1 = ppc_hash32_direct_store(cpu,sr_00,ea,rwx,&local_68,need_prot + 1);
      if (iVar1 == 0) {
        tlb_set_page_ppc(&cpu->parent_obj,ea & 0xfffff000,local_68 & 0xfffff000,need_prot[1],mmu_idx
                         ,0x1000);
        cpu_local._4_4_ = 0;
      }
      else {
        cpu_local._4_4_ = 1;
      }
    }
  }
  return cpu_local._4_4_;
}

Assistant:

int ppc_hash32_handle_mmu_fault(PowerPCCPU *cpu, vaddr eaddr, int rwx,
                                int mmu_idx)
{
    CPUState *cs = CPU(cpu);
    CPUPPCState *env = &cpu->env;
    target_ulong sr;
    hwaddr pte_offset;
    ppc_hash_pte32_t pte;
    int prot;
    const int need_prot[] = {PAGE_READ, PAGE_WRITE, PAGE_EXEC};
    hwaddr raddr;

    assert((rwx == 0) || (rwx == 1) || (rwx == 2));

    /* 1. Handle real mode accesses */
    if (((rwx == 2) && (msr_ir == 0)) || ((rwx != 2) && (msr_dr == 0))) {
        /* Translation is off */
        raddr = eaddr;
        tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                     PAGE_READ | PAGE_WRITE | PAGE_EXEC, mmu_idx,
                     TARGET_PAGE_SIZE);
        return 0;
    }

    /* 2. Check Block Address Translation entries (BATs) */
    if (env->nb_BATs != 0) {
        raddr = ppc_hash32_bat_lookup(cpu, eaddr, rwx, &prot);
        if (raddr != -1) {
            if (need_prot[rwx] & ~prot) {
                if (rwx == 2) {
                    cs->exception_index = POWERPC_EXCP_ISI;
                    env->error_code = 0x08000000;
                } else {
                    cs->exception_index = POWERPC_EXCP_DSI;
                    env->error_code = 0;
                    env->spr[SPR_DAR] = eaddr;
                    if (rwx == 1) {
                        env->spr[SPR_DSISR] = 0x0a000000;
                    } else {
                        env->spr[SPR_DSISR] = 0x08000000;
                    }
                }
                return 1;
            }

            tlb_set_page(cs, eaddr & TARGET_PAGE_MASK,
                         raddr & TARGET_PAGE_MASK, prot, mmu_idx,
                         TARGET_PAGE_SIZE);
            return 0;
        }
    }

    /* 3. Look up the Segment Register */
    sr = env->sr[eaddr >> 28];

    /* 4. Handle direct store segments */
    if (sr & SR32_T) {
        if (ppc_hash32_direct_store(cpu, sr, eaddr, rwx,
                                    &raddr, &prot) == 0) {
            tlb_set_page(cs, eaddr & TARGET_PAGE_MASK,
                         raddr & TARGET_PAGE_MASK, prot, mmu_idx,
                         TARGET_PAGE_SIZE);
            return 0;
        } else {
            return 1;
        }
    }

    /* 5. Check for segment level no-execute violation */
    if ((rwx == 2) && (sr & SR32_NX)) {
        cs->exception_index = POWERPC_EXCP_ISI;
        env->error_code = 0x10000000;
        return 1;
    }

    /* 6. Locate the PTE in the hash table */
    pte_offset = ppc_hash32_htab_lookup(cpu, sr, eaddr, &pte);
    if (pte_offset == -1) {
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISI;
            env->error_code = 0x40000000;
        } else {
            cs->exception_index = POWERPC_EXCP_DSI;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
            if (rwx == 1) {
                env->spr[SPR_DSISR] = 0x42000000;
            } else {
                env->spr[SPR_DSISR] = 0x40000000;
            }
        }

        return 1;
    }
    qemu_log_mask(CPU_LOG_MMU,
                "found PTE at offset %08" HWADDR_PRIx "\n", pte_offset);

    /* 7. Check access permissions */

    prot = ppc_hash32_pte_prot(cpu, sr, pte);

    if (need_prot[rwx] & ~prot) {
        /* Access right violation */
        qemu_log_mask(CPU_LOG_MMU, "PTE access rejected\n");
        if (rwx == 2) {
            cs->exception_index = POWERPC_EXCP_ISI;
            env->error_code = 0x08000000;
        } else {
            cs->exception_index = POWERPC_EXCP_DSI;
            env->error_code = 0;
            env->spr[SPR_DAR] = eaddr;
            if (rwx == 1) {
                env->spr[SPR_DSISR] = 0x0a000000;
            } else {
                env->spr[SPR_DSISR] = 0x08000000;
            }
        }
        return 1;
    }

    qemu_log_mask(CPU_LOG_MMU, "PTE access granted !\n");

    /* 8. Update PTE referenced and changed bits if necessary */

    if (!(pte.pte1 & HPTE32_R_R)) {
        ppc_hash32_set_r(cpu, pte_offset, pte.pte1);
    }
    if (!(pte.pte1 & HPTE32_R_C)) {
        if (rwx == 1) {
            ppc_hash32_set_c(cpu, pte_offset, pte.pte1);
        } else {
            /*
             * Treat the page as read-only for now, so that a later write
             * will pass through this function again to set the C bit
             */
            prot &= ~PAGE_WRITE;
        }
     }

    /* 9. Determine the real address from the PTE */

    raddr = ppc_hash32_pte_raddr(sr, pte, eaddr);

    tlb_set_page(cs, eaddr & TARGET_PAGE_MASK, raddr & TARGET_PAGE_MASK,
                 prot, mmu_idx, TARGET_PAGE_SIZE);

    return 0;
}